

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O0

void __thiscall sznet::net::SelectPoller::updateChannel(SelectPoller *this,Channel *channel)

{
  Channel *pCVar1;
  bool bVar2;
  LogLevel LVar3;
  sz_fd sVar4;
  uint uVar5;
  int iVar6;
  LogStream *pLVar7;
  self *psVar8;
  char *pcVar9;
  size_type sVar10;
  mapped_type *ppCVar11;
  reference pvVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  key_type *__k;
  SourceFile file;
  Event_t *event_1;
  int idx_1;
  sz_fd local_103c;
  _Self local_1038;
  int local_102c;
  sz_fd local_1028;
  int idx;
  Event_t event;
  sz_fd local_1014;
  _Self local_1010 [3];
  undefined1 local_ff8 [12];
  Logger local_fe8;
  Channel *local_18;
  Channel *channel_local;
  SelectPoller *this_local;
  
  local_18 = channel;
  channel_local = (Channel *)this;
  Poller::assertInLoopThread(&this->super_Poller);
  LVar3 = Logger::logLevel();
  iVar6 = extraout_EDX;
  if ((int)LVar3 < 1) {
    Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_ff8,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    Logger::Logger(&local_fe8,file,0x70,TRACE,"updateChannel");
    pLVar7 = Logger::stream(&local_fe8);
    psVar8 = LogStream::operator<<(pLVar7,"fd = ");
    sVar4 = Channel::fd(local_18);
    pLVar7 = LogStream::operator<<(psVar8,sVar4);
    psVar8 = LogStream::operator<<(pLVar7," events = ");
    uVar5 = Channel::events(local_18);
    channel = (Channel *)(ulong)uVar5;
    LogStream::operator<<(psVar8,uVar5);
    Logger::~Logger(&local_fe8);
    iVar6 = extraout_EDX_00;
  }
  pcVar9 = Channel::index(local_18,(char *)channel,iVar6);
  if ((int)pcVar9 < 0) {
    local_1014 = Channel::fd(local_18);
    local_1010[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
         ::find(&(this->super_Poller).m_channels,&local_1014);
    event = (Event_t)std::
                     map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                     ::end(&(this->super_Poller).m_channels);
    bVar2 = std::operator==(local_1010,(_Self *)&event);
    if (!bVar2) {
      __assert_fail("m_channels.find(channel->fd()) == m_channels.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x74,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    Channel::Event_t::Event_t((Event_t *)&stack0xffffffffffffefd8);
    local_1028 = Channel::fd(local_18);
    idx = Channel::events(local_18);
    std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
    push_back(&this->m_pollfds,(value_type *)&stack0xffffffffffffefd8);
    sVar10 = std::
             vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
             size(&this->m_pollfds);
    local_102c = (int)sVar10 + -1;
    Channel::set_index(local_18,local_102c);
    pCVar1 = local_18;
    ppCVar11 = std::
               map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
               ::operator[](&(this->super_Poller).m_channels,&stack0xffffffffffffefd8);
    *ppCVar11 = pCVar1;
  }
  else {
    local_103c = Channel::fd(local_18);
    local_1038._M_node =
         (_Base_ptr)
         std::
         map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
         ::find(&(this->super_Poller).m_channels,&local_103c);
    _idx_1 = std::
             map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
             ::end(&(this->super_Poller).m_channels);
    bVar2 = std::operator!=(&local_1038,(_Self *)&idx_1);
    if (!bVar2) {
      __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x81,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    event_1._4_4_ = Channel::fd(local_18);
    __k = (key_type *)((long)&event_1 + 4);
    ppCVar11 = std::
               map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
               ::operator[](&(this->super_Poller).m_channels,__k);
    if (*ppCVar11 != local_18) {
      __assert_fail("m_channels[channel->fd()] == channel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x82,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    pcVar9 = Channel::index(local_18,(char *)__k,__c);
    iVar6 = (int)pcVar9;
    bVar2 = false;
    event_1._0_4_ = iVar6;
    if (-1 < iVar6) {
      sVar10 = std::
               vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
               size(&this->m_pollfds);
      bVar2 = iVar6 < (int)sVar10;
    }
    if (!bVar2) {
      __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x84,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    pvVar12 = std::
              vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
              operator[](&this->m_pollfds,(long)(int)event_1);
    iVar6 = pvVar12->fd;
    sVar4 = Channel::fd(local_18);
    if (iVar6 != sVar4) {
      __assert_fail("event.fd == channel->fd()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x86,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
    uVar5 = Channel::events(local_18);
    pvVar12->ev = uVar5;
  }
  return;
}

Assistant:

void SelectPoller::updateChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd() << " events = " << channel->events();
	// add
	if (channel->index() < 0)
	{
		assert(m_channels.find(channel->fd()) == m_channels.end());
		Channel::Event_t event;
		event.fd = channel->fd();
		event.ev = channel->events();
		m_pollfds.push_back(event);
		int idx = static_cast<int>(m_pollfds.size()) - 1;
		channel->set_index(idx);
		m_channels[event.fd] = channel;
	}
	// mod
	else
	{
		// channel事件有能为kNoneEvent
		assert(m_channels.find(channel->fd()) != m_channels.end());
		assert(m_channels[channel->fd()] == channel);
		int idx = channel->index();
		assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
		Channel::Event_t& event = m_pollfds[idx];
		assert(event.fd == channel->fd());
		event.ev = channel->events();
	}
}